

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O3

void __thiscall
GPIO::GPIOBase::SoftThread::SoftThread
          (SoftThread *this,GPIO_MODE what,uint gpio,uint range,uint value)

{
  thread *this_00;
  runtime_error *this_01;
  pointer *__ptr;
  SoftThread *local_38;
  code *local_30;
  undefined8 local_28;
  
  (this->m_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  this->m_range = range;
  this->m_value = value;
  this->m_mark = (__atomic_base<unsigned_int>)0x0;
  this->m_space = (__atomic_base<unsigned_int>)0x0;
  this->m_gpio = gpio;
  if (range == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"range == 0");
  }
  else {
    if (value <= range) {
      set_value(this,value);
      local_38 = this;
      if (what == SOFT_TONE_OUTPUT) {
        local_30 = run_tone;
        local_28 = 0;
        this_00 = (thread *)operator_new(8);
        std::thread::thread<void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*,void>
                  (this_00,(offset_in_SoftThread_to_subr *)&local_30,&local_38);
      }
      else {
        if (what != SOFT_PWM_OUTPUT) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"invalid mode");
          goto LAB_0010d827;
        }
        local_30 = run_pwm;
        local_28 = 0;
        this_00 = (thread *)operator_new(8);
        std::thread::thread<void(GPIO::GPIOBase::SoftThread::*)(),GPIO::GPIOBase::SoftThread*,void>
                  (this_00,(offset_in_SoftThread_to_subr *)&local_30,&local_38);
      }
      std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,this_00);
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"value > range");
  }
LAB_0010d827:
  *(undefined ***)this_01 = &PTR__runtime_error_001169a8;
  __cxa_throw(this_01,&GPIOError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GPIOBase::SoftThread::SoftThread(GPIO_MODE what, unsigned int gpio, unsigned int range, unsigned int value)
: m_range(range)
, m_value(value)
, m_gpio(gpio)
{
    if (m_range == 0) throw GPIOError("range == 0");
    if (m_value > m_range) throw GPIOError("value > range");

    // compute the mark and space values

    set_value(m_value);

    switch (what) {
        case GPIO_MODE::SOFT_PWM_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_pwm, this);
            break;
        case GPIO_MODE::SOFT_TONE_OUTPUT:
            m_thread = std::make_unique<std::thread>(&GPIOBase::SoftThread::run_tone, this);
            break;
        default: throw GPIOError("invalid mode");
    }
}